

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall
ghc::filesystem::recursive_directory_iterator::pop(recursive_directory_iterator *this)

{
  bool bVar1;
  int code;
  filesystem_error *this_00;
  element_type *peVar2;
  reference this_01;
  directory_entry *this_02;
  path *p;
  error_code ec_00;
  path local_70;
  string local_40;
  undefined1 auStack_20 [8];
  error_code ec;
  recursive_directory_iterator *this_local;
  
  ec._M_cat = (error_category *)this;
  std::error_code::error_code((error_code *)auStack_20);
  pop(this,(error_code *)auStack_20);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_20);
  if (!bVar1) {
    return;
  }
  this_00 = (filesystem_error *)__cxa_allocate_exception(0x90);
  code = std::error_code::value((error_code *)auStack_20);
  detail::systemErrorText<int>(&local_40,code);
  peVar2 = std::
           __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  bVar1 = std::
          stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
          ::empty(&peVar2->_dir_iter_stack);
  if (bVar1) {
    path::path(&local_70);
  }
  else {
    peVar2 = std::
             __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    this_01 = std::
              stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
              ::top(&peVar2->_dir_iter_stack);
    this_02 = directory_iterator::operator->(this_01);
    p = directory_entry::path(this_02);
    path::path(&local_70,p);
  }
  ec_00._0_8_ = (ulong)auStack_20 & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  filesystem_error::filesystem_error(this_00,&local_40,&local_70,ec_00);
  __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void recursive_directory_iterator::pop()
{
    std::error_code ec;
    pop(ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), _impl->_dir_iter_stack.empty() ? path() : _impl->_dir_iter_stack.top()->path(), ec);
    }
}